

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void us_socket_remote_address(int ssl,us_socket_t *s,char *buf,int *length)

{
  int iVar1;
  int iVar2;
  char *__src;
  int *in_RCX;
  void *in_RDX;
  us_poll_t *in_RSI;
  bsd_addr_t addr;
  bsd_addr_t *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  bsd_addr_t local_b8;
  int *local_20;
  void *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  us_poll_fd(in_RSI);
  iVar1 = bsd_socket_addr(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((iVar1 == 0) && (iVar1 = *local_20, iVar2 = bsd_addr_get_ip_length(&local_b8), iVar2 <= iVar1)
     ) {
    iVar1 = bsd_addr_get_ip_length(&local_b8);
    *local_20 = iVar1;
    __src = bsd_addr_get_ip(&local_b8);
    memcpy(local_18,__src,(long)*local_20);
    return;
  }
  *local_20 = 0;
  return;
}

Assistant:

void us_socket_remote_address(int ssl, struct us_socket_t *s, char *buf, int *length) {
    struct bsd_addr_t addr;
    if (bsd_socket_addr(us_poll_fd(&s->p), &addr) || *length < bsd_addr_get_ip_length(&addr)) {
        *length = 0;
    } else {
        *length = bsd_addr_get_ip_length(&addr);
        memcpy(buf, bsd_addr_get_ip(&addr), *length);
    }
}